

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O1

void R_InstallSprite(int num,spriteframewithrotate *sprtemp,int *maxframe)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  TextureHash *pTVar12;
  spriteframe_t *psVar13;
  uint uVar14;
  WORD WVar15;
  int *piVar16;
  long lVar17;
  FTextureID *pFVar18;
  ulong uVar19;
  int rot;
  FTextureID *pFVar20;
  uint uVar21;
  long lVar22;
  
  iVar4 = *maxframe;
  if (iVar4 == -1) {
    sprites.Array[num].numframes = '\0';
  }
  else {
    *maxframe = iVar4 + 1;
    if (-1 < iVar4) {
      pFVar18 = (sprtemp->super_spriteframe_t).Texture + 1;
      pFVar20 = (sprtemp->super_spriteframe_t).Texture;
      lVar22 = 0;
      do {
        iVar4 = *(int *)&sprtemp[lVar22].super_spriteframe_t.field_0x4c;
        if (iVar4 == 1) {
          lVar17 = 0;
          do {
            if (pFVar18[lVar17].texnum < 1) {
              pFVar18[lVar17].texnum = pFVar18[lVar17 + -1].texnum;
              uVar3 = sprtemp[lVar22].super_spriteframe_t.Flip;
              if ((uVar3 >> ((uint)lVar17 & 0x1f) & 1) != 0) {
                sprtemp[lVar22].super_spriteframe_t.Flip =
                     uVar3 | (ushort)(2 << ((byte)lVar17 & 0x1f));
              }
            }
            if (pFVar18[lVar17 + -1].texnum < 1) {
              pFVar18[lVar17 + -1].texnum = pFVar18[lVar17].texnum;
              uVar3 = sprtemp[lVar22].super_spriteframe_t.Flip;
              if ((uVar3 >> ((byte)lVar17 & 0x1f) & 2) != 0) {
                sprtemp[lVar22].super_spriteframe_t.Flip =
                     uVar3 | (ushort)(1 << ((uint)lVar17 & 0x1f));
              }
            }
            lVar17 = lVar17 + 2;
          } while (lVar17 != 0x10);
          lVar17 = 0;
          do {
            if (pFVar20[lVar17].texnum < 1) {
              I_FatalError("R_InstallSprite: Sprite %s frame %c is missing rotations",
                           sprites.Array + num,(ulong)((int)lVar22 + 0x41));
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
        }
        else if (iVar4 == 0) {
          lVar17 = 0;
          do {
            pFVar18[lVar17].texnum = sprtemp[lVar22].super_spriteframe_t.Texture[0].texnum;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0xf);
          if ((sprtemp[lVar22].super_spriteframe_t.Flip & 1) != 0) {
            sprtemp[lVar22].super_spriteframe_t.Flip = 0xffff;
          }
        }
        lVar22 = lVar22 + 1;
        pFVar18 = pFVar18 + 0x14;
        pFVar20 = pFVar20 + 0x14;
      } while (lVar22 < *maxframe);
    }
    uVar21 = *maxframe;
    if (0 < (int)uVar21) {
      piVar16 = (int *)&(sprtemp->super_spriteframe_t).field_0x4c;
      lVar22 = 0;
      do {
        if (*piVar16 == -1) {
          *piVar16 = 0;
          piVar16[-0x11] = 0;
          piVar16[-0x10] = 0;
          piVar16[-0xf] = 0;
          piVar16[-0xe] = 0;
          piVar16[-0xd] = 0;
          piVar16[-0xc] = 0;
          piVar16[-0xb] = 0;
          piVar16[-10] = 0;
          piVar16[-9] = 0;
          piVar16[-8] = 0;
          piVar16[-7] = 0;
          piVar16[-6] = 0;
          piVar16[-5] = 0;
          piVar16[-4] = 0;
          piVar16[-3] = 0;
          piVar16[-2] = 0;
          *(undefined2 *)(piVar16 + -1) = 0;
        }
        lVar22 = lVar22 + 1;
        uVar21 = *maxframe;
        piVar16 = piVar16 + 0x14;
      } while (lVar22 < (int)uVar21);
    }
    sprites.Array[num].numframes = (BYTE)uVar21;
    TArray<spriteframe_t,_spriteframe_t>::Grow(&SpriteFrames,uVar21);
    uVar14 = SpriteFrames.Count;
    WVar15 = (WORD)SpriteFrames.Count;
    SpriteFrames.Count = uVar21 + SpriteFrames.Count;
    sprites.Array[num].spriteframes = WVar15;
    psVar13 = SpriteFrames.Array;
    uVar21 = *maxframe;
    if (0 < (int)uVar21) {
      lVar22 = 0;
      lVar17 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0].texnum + lVar22);
        uVar5 = *puVar2;
        uVar6 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[4].texnum + lVar22);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[8].texnum + lVar22);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)&(sprtemp->super_spriteframe_t).Texture[0xc].texnum + lVar22);
        uVar11 = puVar2[1];
        puVar1 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[0xc].texnum + lVar22);
        *puVar1 = *puVar2;
        puVar1[1] = uVar11;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[8].texnum + lVar22);
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[4].texnum + lVar22);
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        puVar2 = (undefined8 *)((long)&psVar13[(int)uVar14].Texture[0].texnum + lVar22);
        *puVar2 = uVar5;
        puVar2[1] = uVar6;
        *(undefined2 *)((long)(psVar13[(int)uVar14].Texture + 0x10) + lVar22) =
             *(undefined2 *)((long)((sprtemp->super_spriteframe_t).Texture + 0x10) + lVar22);
        *(undefined8 *)
         ((long)&((spriteframe_t *)(psVar13[(int)uVar14].Texture + -2))->Voxel + lVar22) =
             *(undefined8 *)
              ((long)&((spriteframe_t *)((sprtemp->super_spriteframe_t).Texture + -2))->Voxel +
              lVar22);
        lVar17 = lVar17 + 1;
        uVar21 = *maxframe;
        lVar22 = lVar22 + 0x50;
      } while (lVar17 < (int)uVar21);
    }
    pTVar12 = TexMan.Textures.Array;
    if (0 < (int)uVar21) {
      pFVar18 = (sprtemp->super_spriteframe_t).Texture;
      uVar19 = 0;
      do {
        if (*(int *)&sprtemp[uVar19].super_spriteframe_t.field_0x4c == 1) {
          lVar22 = 0;
          do {
            (pTVar12[pFVar18[lVar22].texnum].Texture)->Rotations = (short)uVar19 + WVar15;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x10);
        }
        uVar19 = uVar19 + 1;
        pFVar18 = pFVar18 + 0x14;
      } while (uVar19 != uVar21);
    }
  }
  return;
}

Assistant:

static void R_InstallSprite (int num, spriteframewithrotate *sprtemp, int &maxframe)
{
	int frame;
	int framestart;
	int rot;
//	int undefinedFix;

	if (maxframe == -1)
	{
		sprites[num].numframes = 0;
		return;
	}

	maxframe++;

	// [RH] If any frames are undefined, but there are some defined frames, map
	// them to the first defined frame. This is a fix for Doom Raider, which actually
	// worked with ZDoom 2.0.47, because of a bug here. It does not define frames A,
	// B, or C for the sprite PSBG, but because I had sprtemp[].rotate defined as a
	// bool, this code never detected that it was not actually present. After switching
	// to the unified texture system, this caused it to crash while loading the wad.

// [RH] Let undefined frames actually be blank because LWM uses this in at least
// one of her wads.
//	for (frame = 0; frame < maxframe && sprtemp[frame].rotate == -1; ++frame)
//	{ }
//
//	undefinedFix = frame;

	for (frame = 0; frame < maxframe; ++frame)
	{
		switch (sprtemp[frame].rotate)
		{
		case -1:
			// no rotations were found for that frame at all
			//I_FatalError ("R_InstallSprite: No patches found for %s frame %c", sprites[num].name, frame+'A');
			break;
			
		case 0:
			// only the first rotation is needed
			for (rot = 1; rot < 16; ++rot)
			{
				sprtemp[frame].Texture[rot] = sprtemp[frame].Texture[0];
			}
			// If the frame is flipped, they all should be
			if (sprtemp[frame].Flip & 1)
			{
				sprtemp[frame].Flip = 0xFFFF;
			}
			break;
					
		case 1:
			// must have all 8 frame pairs
			for (rot = 0; rot < 8; ++rot)
			{
				if (!sprtemp[frame].Texture[rot*2+1].isValid())
				{
					sprtemp[frame].Texture[rot*2+1] = sprtemp[frame].Texture[rot*2];
					if (sprtemp[frame].Flip & (1 << (rot*2)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2+1);
					}
				}
				if (!sprtemp[frame].Texture[rot*2].isValid())
				{
					sprtemp[frame].Texture[rot*2] = sprtemp[frame].Texture[rot*2+1];
					if (sprtemp[frame].Flip & (1 << (rot*2+1)))
					{
						sprtemp[frame].Flip |= 1 << (rot*2);
					}
				}

			}
			for (rot = 0; rot < 16; ++rot)
			{
				if (!sprtemp[frame].Texture[rot].isValid())
					I_FatalError ("R_InstallSprite: Sprite %s frame %c is missing rotations",
									sprites[num].name, frame+'A');
			}
			break;
		}
	}

	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == -1)
		{
			memset (&sprtemp[frame].Texture, 0, sizeof(sprtemp[0].Texture));
			sprtemp[frame].Flip = 0;
			sprtemp[frame].rotate = 0;
		}
	}
	
	// allocate space for the frames present and copy sprtemp to it
	sprites[num].numframes = maxframe;
	sprites[num].spriteframes = WORD(framestart = SpriteFrames.Reserve (maxframe));
	for (frame = 0; frame < maxframe; ++frame)
	{
		memcpy (SpriteFrames[framestart+frame].Texture, sprtemp[frame].Texture, sizeof(sprtemp[frame].Texture));
		SpriteFrames[framestart+frame].Flip = sprtemp[frame].Flip;
		SpriteFrames[framestart+frame].Voxel = sprtemp[frame].Voxel;
	}

	// Let the textures know about the rotations
	for (frame = 0; frame < maxframe; ++frame)
	{
		if (sprtemp[frame].rotate == 1)
		{
			for (int rot = 0; rot < 16; ++rot)
			{
				TexMan[sprtemp[frame].Texture[rot]]->Rotations = framestart + frame;
			}
		}
	}
}